

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O0

string * __thiscall
ws::time_to_str_abi_cxx11_(string *__return_storage_ptr__,ws *this,time_point *now)

{
  allocator<char> local_69;
  char acStack_68 [8];
  char date [60];
  tm *ptm;
  time_t tt;
  time_point *now_local;
  
  tt = (time_t)this;
  now_local = (time_point *)__return_storage_ptr__;
  ptm = (tm *)std::chrono::_V2::system_clock::to_time_t((time_point *)this);
  register0x00000000 = localtime((time_t *)&ptm);
  date[0x28] = '\0';
  date[0x29] = '\0';
  date[0x2a] = '\0';
  date[0x2b] = '\0';
  date[0x2c] = '\0';
  date[0x2d] = '\0';
  date[0x2e] = '\0';
  date[0x2f] = '\0';
  date[0x30] = '\0';
  date[0x31] = '\0';
  date[0x32] = '\0';
  date[0x33] = '\0';
  date[0x18] = '\0';
  date[0x19] = '\0';
  date[0x1a] = '\0';
  date[0x1b] = '\0';
  date[0x1c] = '\0';
  date[0x1d] = '\0';
  date[0x1e] = '\0';
  date[0x1f] = '\0';
  date[0x20] = '\0';
  date[0x21] = '\0';
  date[0x22] = '\0';
  date[0x23] = '\0';
  date[0x24] = '\0';
  date[0x25] = '\0';
  date[0x26] = '\0';
  date[0x27] = '\0';
  date[8] = '\0';
  date[9] = '\0';
  date[10] = '\0';
  date[0xb] = '\0';
  date[0xc] = '\0';
  date[0xd] = '\0';
  date[0xe] = '\0';
  date[0xf] = '\0';
  date[0x10] = '\0';
  date[0x11] = '\0';
  date[0x12] = '\0';
  date[0x13] = '\0';
  date[0x14] = '\0';
  date[0x15] = '\0';
  date[0x16] = '\0';
  date[0x17] = '\0';
  acStack_68[0] = '\0';
  acStack_68[1] = '\0';
  acStack_68[2] = '\0';
  acStack_68[3] = '\0';
  acStack_68[4] = '\0';
  acStack_68[5] = '\0';
  acStack_68[6] = '\0';
  acStack_68[7] = '\0';
  date[0] = '\0';
  date[1] = '\0';
  date[2] = '\0';
  date[3] = '\0';
  date[4] = '\0';
  date[5] = '\0';
  date[6] = '\0';
  date[7] = '\0';
  sprintf(acStack_68,"%d-%02d-%02d %02d:%02d:%02d",(ulong)(register0x00000000->tm_year + 0x76c),
          (ulong)(register0x00000000->tm_mon + 1),(ulong)(uint)register0x00000000->tm_mday,
          (ulong)(uint)register0x00000000->tm_hour,register0x00000000->tm_min,
          register0x00000000->tm_sec);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,acStack_68,&local_69);
  std::allocator<char>::~allocator(&local_69);
  return __return_storage_ptr__;
}

Assistant:

std::string time_to_str(const std::chrono::system_clock::time_point &now)
  {
    auto tt = std::chrono::system_clock::to_time_t(now);
    struct tm *ptm = localtime(&tt);
    char date[60] = {0};
    sprintf(date, "%d-%02d-%02d %02d:%02d:%02d",
            (int) ptm->tm_year + 1900, (int) ptm->tm_mon + 1, (int) ptm->tm_mday,
            (int) ptm->tm_hour, (int) ptm->tm_min, (int) ptm->tm_sec);
    return {date};
  }